

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BranchLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_branch(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  BranchLayerParams *pBVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_branch(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_branch(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pBVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::BranchLayerParams>(arena);
    (this->layer_).branch_ = pBVar2;
  }
  return (BranchLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BranchLayerParams* NeuralNetworkLayer::_internal_mutable_branch() {
  if (!_internal_has_branch()) {
    clear_layer();
    set_has_branch();
    layer_.branch_ = CreateMaybeMessage< ::CoreML::Specification::BranchLayerParams >(GetArenaForAllocation());
  }
  return layer_.branch_;
}